

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_view_impl(ggml_context *ctx,ggml_tensor *a,int n_dims,int64_t *ne,size_t offset)

{
  ggml_tensor *tensor;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  size_t in_stack_00000180;
  ggml_tensor *in_stack_00000188;
  int64_t *in_stack_00000190;
  int in_stack_00000198;
  ggml_type in_stack_0000019c;
  ggml_context *in_stack_000001a0;
  void *in_stack_ffffffffffffffc8;
  
  tensor = ggml_new_tensor_impl
                     (in_stack_000001a0,in_stack_0000019c,in_stack_00000198,in_stack_00000190,
                      in_stack_00000188,in_stack_00000180);
  ggml_format_name(tensor,"%s (view)",in_RSI->name);
  ggml_set_op_params(tensor,in_stack_ffffffffffffffc8,0x14e168);
  tensor->op = GGML_OP_VIEW;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_view_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_dims,
        const int64_t       * ne,
        size_t                offset) {
    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, n_dims, ne, a, offset);
    ggml_format_name(result, "%s (view)", a->name);

    ggml_set_op_params(result, &offset, sizeof(offset));

    result->op     = GGML_OP_VIEW;
    result->src[0] = a;

    return result;
}